

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraphPath.cc
# Opt level: O2

bool __thiscall SequenceDistanceGraphPath::is_canonical(SequenceDistanceGraphPath *this)

{
  bool bVar1;
  SequenceDistanceGraphPath rp;
  SequenceDistanceGraphPath SStack_78;
  string local_58;
  string local_38;
  
  SequenceDistanceGraphPath(&SStack_78,this);
  reverse(&SStack_78);
  sequence_abi_cxx11_(&local_58,this);
  sequence_abi_cxx11_(&local_38,&SStack_78);
  bVar1 = std::operator<(&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&SStack_78);
  return bVar1;
}

Assistant:

bool SequenceDistanceGraphPath::is_canonical() {
    auto rp=*this;
    rp.reverse();
    return sequence()< rp.sequence();
}